

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thpool.c
# Opt level: O0

void thpool_destroy(thpool_ *thpool_p)

{
  bool bVar1;
  int local_3c;
  double dStack_38;
  int n;
  double tpassed;
  time_t end;
  time_t start;
  double TIMEOUT;
  thpool_ *ptStack_10;
  int threads_total;
  thpool_ *thpool_p_local;
  
  if (thpool_p != (thpool_ *)0x0) {
    TIMEOUT._4_4_ = thpool_p->num_threads_alive;
    threads_keepalive = 0;
    start = 0x3ff0000000000000;
    dStack_38 = 0.0;
    ptStack_10 = thpool_p;
    time(&end);
    while( true ) {
      bVar1 = false;
      if (dStack_38 < (double)start) {
        bVar1 = ptStack_10->num_threads_alive != 0;
      }
      if (!bVar1) break;
      bsem_post_all((ptStack_10->jobqueue).has_jobs);
      time((time_t *)&tpassed);
      dStack_38 = difftime((time_t)tpassed,end);
    }
    while (ptStack_10->num_threads_alive != 0) {
      bsem_post_all((ptStack_10->jobqueue).has_jobs);
      sleep(1);
    }
    jobqueue_destroy(&ptStack_10->jobqueue);
    for (local_3c = 0; local_3c < TIMEOUT._4_4_; local_3c = local_3c + 1) {
      thread_destroy(ptStack_10->threads[local_3c]);
    }
    free(ptStack_10->threads);
    free(ptStack_10);
  }
  return;
}

Assistant:

void thpool_destroy(thpool_* thpool_p){
	/* No need to destory if it's NULL */
	if (thpool_p == NULL) return ;

	volatile int threads_total = thpool_p->num_threads_alive;

	/* End each thread 's infinite loop */
	threads_keepalive = 0;

	/* Give one second to kill idle threads */
	double TIMEOUT = 1.0;
	time_t start, end;
	double tpassed = 0.0;
	time (&start);
	while (tpassed < TIMEOUT && thpool_p->num_threads_alive){
		bsem_post_all(thpool_p->jobqueue.has_jobs);
		time (&end);
		tpassed = difftime(end,start);
	}

	/* Poll remaining threads */
	while (thpool_p->num_threads_alive){
		bsem_post_all(thpool_p->jobqueue.has_jobs);
		sleep(1);
	}

	/* Job queue cleanup */
	jobqueue_destroy(&thpool_p->jobqueue);
	/* Deallocs */
	int n;
	for (n=0; n < threads_total; n++){
		thread_destroy(thpool_p->threads[n]);
	}
	free(thpool_p->threads);
	free(thpool_p);
}